

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

void * gguf_get_arr_data(gguf_context *ctx,int64_t key_id)

{
  pointer pgVar1;
  char *pcVar2;
  int line;
  
  if (-1 < key_id) {
    pgVar1 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (key_id < ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pgVar1) / 0x58) {
      if (pgVar1[key_id].type != GGUF_TYPE_STRING) {
        return pgVar1[key_id].data.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      }
      pcVar2 = "ctx->kv[key_id].get_type() != GGUF_TYPE_STRING";
      line = 0x30c;
      goto LAB_0013f3cf;
    }
  }
  pcVar2 = "key_id >= 0 && key_id < gguf_get_n_kv(ctx)";
  line = 0x30b;
LAB_0013f3cf:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

const void * gguf_get_arr_data(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    GGML_ASSERT(ctx->kv[key_id].get_type() != GGUF_TYPE_STRING);
    return ctx->kv[key_id].data.data();
}